

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compress1X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int bmi2)

{
  int bmi2_local;
  HUF_CElt *CTable_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstSize_local;
  void *dst_local;
  
  if (bmi2 == 0) {
    dst_local = (void *)HUF_compress1X_usingCTable_internal_default(dst,dstSize,src,srcSize,CTable);
  }
  else {
    dst_local = (void *)HUF_compress1X_usingCTable_internal_bmi2(dst,dstSize,src,srcSize,CTable);
  }
  return (size_t)dst_local;
}

Assistant:

static size_t
HUF_compress1X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, const int bmi2)
{
    if (bmi2) {
        return HUF_compress1X_usingCTable_internal_bmi2(dst, dstSize, src, srcSize, CTable);
    }
    return HUF_compress1X_usingCTable_internal_default(dst, dstSize, src, srcSize, CTable);
}